

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.h
# Opt level: O1

bool flatbuffers::StringToNumber<unsigned_char>(char *s,uchar *val)

{
  byte bVar1;
  byte *pbVar2;
  ulong uVar3;
  uchar uVar4;
  int __base;
  ulong uVar5;
  bool bVar6;
  bool bVar7;
  char *endptr;
  char *local_20;
  
  if ((s == (char *)0x0) || (pbVar2 = (byte *)s, val == (uchar *)0x0)) {
    __assert_fail("s && val",
                  "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/include/flatbuffers/util.h"
                  ,0x14b,"bool flatbuffers::StringToNumber(const char *, T *) [T = unsigned char]");
  }
  do {
    bVar1 = *pbVar2;
    pbVar2 = pbVar2 + 1;
    if (bVar1 == 0) break;
  } while (9 < (int)(char)bVar1 - 0x30U);
  if ((bVar1 == 0x30) && ((*pbVar2 & 0xdf) == 0x58)) {
    __base = 0x10;
  }
  else {
    __base = 10;
  }
  local_20 = s;
  uVar3 = strtoll_l(s,&local_20,__base,ClassicLocale::instance_);
  bVar6 = *local_20 == '\0';
  bVar7 = local_20 != s;
  uVar5 = 0;
  if (bVar7 && bVar6) {
    uVar5 = uVar3;
  }
  uVar3 = 0xff;
  if (uVar5 < 0xff) {
    uVar3 = uVar5;
  }
  uVar4 = '\0';
  if (bVar7 && bVar6) {
    uVar4 = (uchar)uVar3;
  }
  *val = uVar4;
  return uVar5 < 0x100 && (bVar7 && bVar6);
}

Assistant:

inline bool StringToNumber(const char *s, T *val) {
  // Assert on `unsigned long` and `signed long` on LP64.
  // If it is necessary, it could be solved with flatbuffers::enable_if<B,T>.
  static_assert(sizeof(T) < sizeof(int64_t), "unexpected type T");
  FLATBUFFERS_ASSERT(s && val);
  int64_t i64;
  // The errno check isn't needed, will return MAX/MIN on overflow.
  if (StringToIntegerImpl(&i64, s, 0, false)) {
    const int64_t max = (flatbuffers::numeric_limits<T>::max)();
    const int64_t min = flatbuffers::numeric_limits<T>::lowest();
    if (i64 > max) {
      *val = static_cast<T>(max);
      return false;
    }
    if (i64 < min) {
      // For unsigned types return max to distinguish from
      // "no conversion can be performed" when 0 is returned.
      *val = static_cast<T>(flatbuffers::is_unsigned<T>::value ? max : min);
      return false;
    }
    *val = static_cast<T>(i64);
    return true;
  }
  *val = 0;
  return false;
}